

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall Fifteen::slotLoadGraphic(Fifteen *this)

{
  int *piVar1;
  undefined8 uVar2;
  QArrayData *pQVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  QArrayData *pQVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QImage image;
  QArrayData *local_a8 [2];
  undefined8 local_98;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  QArrayData *local_68;
  undefined8 uStack_60;
  long local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  QArrayData *local_28;
  undefined8 uStack_20;
  long local_18;
  
  QVar8.m_data = (storage_type *)0x0;
  QVar8.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar8);
  local_68 = (QArrayData *)CONCAT44(uStack_84,local_88);
  uStack_60 = CONCAT44(uStack_7c,uStack_80);
  local_58 = local_78;
  QVar9.m_data = (storage_type *)0x0;
  QVar9.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar9);
  local_a8[0] = (QArrayData *)CONCAT44(uStack_84,local_88);
  local_98 = local_78;
  QDir::currentPath();
  QMetaObject::tr((char *)&local_48,(char *)&staticMetaObject,0x1174c0);
  QFileDialog::getOpenFileName(&local_28,this,local_a8,&local_88,&local_48,0,0);
  lVar4 = local_18;
  pQVar3 = local_28;
  uVar2 = uStack_60;
  pQVar7 = local_68;
  local_28 = local_68;
  local_68 = pQVar3;
  uStack_60 = uStack_20;
  uStack_20 = uVar2;
  local_18 = local_58;
  local_58 = lVar4;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar7,2,8);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_44,local_48);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_44,local_48),2,8);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,8);
    }
  }
  if (local_a8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8[0],2,8);
    }
  }
  if (local_58 == 0) goto LAB_0010b6ea;
  QImage::QImage((QImage *)&local_28);
  QImage::load((QString *)&local_28,(char *)&local_68);
  cVar5 = QImage::isNull();
  if (cVar5 == '\0') {
    bVar6 = Controller::loadGraphic
                      ((this->controller)._M_t.
                       super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                       super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                       super__Head_base<0UL,_Controller_*,_false>._M_head_impl,(QImage *)&local_28);
    if (bVar6) {
      MenuBar::setActionMenuState
                ((this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>.
                 _M_t.super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
                 super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,REM_GRAPHIC,true);
    }
    QVar12.m_data = (storage_type *)0x0;
    QVar12.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar12);
    local_a8[0] = (QArrayData *)CONCAT44(uStack_84,local_88);
    local_98 = local_78;
    Message::getMessages();
    QMessageBox::information(this,local_a8,&local_88,0x400,0);
    piVar1 = (int *)CONCAT44(uStack_84,local_88);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pQVar7 = (QArrayData *)CONCAT44(uStack_84,local_88);
        goto LAB_0010b6ab;
      }
    }
  }
  else {
    QVar10.m_data = (storage_type *)0x0;
    QVar10.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar10);
    local_a8[0] = (QArrayData *)CONCAT44(uStack_84,local_88);
    local_98 = local_78;
    QVar11.m_data = (storage_type *)0x1c;
    QVar11.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar11);
    local_48 = local_88;
    uStack_44 = uStack_84;
    uStack_40 = uStack_80;
    uStack_3c = uStack_7c;
    local_38 = local_78;
    QMessageBox::information(this,local_a8,&local_48,0x400,0);
    piVar1 = (int *)CONCAT44(uStack_44,local_48);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pQVar7 = (QArrayData *)CONCAT44(uStack_44,local_48);
LAB_0010b6ab:
        QArrayData::deallocate(pQVar7,2,8);
      }
    }
  }
  if (local_a8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8[0],2,8);
    }
  }
  QImage::~QImage((QImage *)&local_28);
LAB_0010b6ea:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  return;
}

Assistant:

void Fifteen::slotLoadGraphic()
{
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath(), tr( "JPG, PNG, GIF, BMP (*.jpg *.png *.gif *.bmp)" ));
         file.isEmpty())
    {
        return;
    }

    QImage image;
    if ( image.load( file ); image.isNull() )
    {
        QMessageBox::information( this, "", "Failure of loading an image\t" );
        return;
    }

    if ( controller->loadGraphic( image ))
    {
        menuBar->setActionMenuState( ActionMenu::REM_GRAPHIC, true );
    }
    QMessageBox::information( this, "", Message::getMessages() );
}